

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

size_t bssl::dtls_record_header_write_len(SSL *ssl,uint16_t epoch)

{
  bool bVar1;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  bVar1 = use_dtls13_record_header(ssl,epoch);
  if (bVar1) {
    ssl_local = (SSL *)0x5;
  }
  else {
    ssl_local = (SSL *)0xd;
  }
  return (size_t)ssl_local;
}

Assistant:

size_t dtls_record_header_write_len(const SSL *ssl, uint16_t epoch) {
  if (!use_dtls13_record_header(ssl, epoch)) {
    return DTLS_PLAINTEXT_RECORD_HEADER_LENGTH;
  }
  // The DTLS 1.3 has a variable length record header. We never send Connection
  // ID, we always send 16-bit sequence numbers, and we send a length. (Length
  // can be omitted, but only for the last record of a packet. Since we send
  // multiple records in one packet, it's easier to implement always sending the
  // length.)
  return DTLS1_3_RECORD_HEADER_WRITE_LENGTH;
}